

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::grisu_count_digits(uint32_t n)

{
  int iVar1;
  
  if (n < 10) {
    iVar1 = 1;
  }
  else if (n < 100) {
    iVar1 = 2;
  }
  else if (n < 1000) {
    iVar1 = 3;
  }
  else if (n < 10000) {
    iVar1 = 4;
  }
  else if (n < 100000) {
    iVar1 = 5;
  }
  else if (n < 1000000) {
    iVar1 = 6;
  }
  else if (n < 10000000) {
    iVar1 = 7;
  }
  else if (n < 100000000) {
    iVar1 = 8;
  }
  else {
    iVar1 = 10 - (uint)(n < 1000000000);
  }
  return iVar1;
}

Assistant:

inline int grisu_count_digits(uint32_t n) {
  if (n < 10) return 1;
  if (n < 100) return 2;
  if (n < 1000) return 3;
  if (n < 10000) return 4;
  if (n < 100000) return 5;
  if (n < 1000000) return 6;
  if (n < 10000000) return 7;
  if (n < 100000000) return 8;
  if (n < 1000000000) return 9;
  return 10;
}